

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O0

void idx2::ComputeBrickResolution(brick_pool *Bp)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  char cVar5;
  int iVar6;
  u64 uVar7;
  long lVar8;
  ulong in_R8;
  v3i Brick3;
  undefined8 uStack_1158;
  int iStack_1150;
  char acStack_114c [1780];
  stack_item *local_a58;
  stack_item *Next;
  stack_item *Child;
  uint local_a2c;
  uint local_a28;
  uint local_a24;
  undefined8 local_a20;
  int local_a18;
  undefined8 local_a10;
  int local_a08;
  undefined8 local_a00;
  v3i ChildBrick3;
  int Z;
  int Y;
  int X;
  int I;
  i8 NextLevel;
  iterator BrickIt;
  u64 BrickKey;
  u64 BrickIndex;
  stack_item Current;
  stack_item *First;
  v3i CurrCoarsestBrick;
  i8 LastIndex;
  stack_item Stack [128];
  idx2_file *Idx2;
  brick_pool *Bp_local;
  undefined8 local_b4;
  undefined8 local_a8;
  int local_a0;
  int *local_98;
  u64 *local_90;
  undefined8 local_88;
  int local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint *local_40;
  int *local_38;
  stack_item **local_30;
  int *local_28;
  undefined8 *local_20;
  u64 local_18;
  array<signed_char> *local_10;
  
  Stack[0x7f]._8_8_ = Bp->Idx2;
  local_a58 = (stack_item *)((long)&CurrCoarsestBrick.field_0.field_4.YZ.field_0 + 4);
  do {
    stack_item::stack_item(local_a58);
    local_a58 = local_a58 + 1;
  } while (local_a58 != (stack_item *)((long)&Stack[0x7f].Brick3.field_0 + 8));
  CurrCoarsestBrick.field_0.field_0.Y._3_1_ = 0;
  First._0_4_ = 0;
  First._4_4_ = 0;
  CurrCoarsestBrick.field_0.field_0.X = 0;
  Current._8_8_ = (long)&CurrCoarsestBrick.field_0 + 8;
  stack0xfffffffffffff698 = 0;
  Stack[0].Brick3.field_0.field_0.X = 0;
  Stack[0].Brick3.field_0._5_1_ = *(char *)(Stack[0x7f]._8_8_ + 0x9e8) + -1;
  Stack[0].Brick3.field_0.field_0.Y._0_1_ = Stack[0].Brick3.field_0._5_1_;
  while( true ) {
    do {
      if ((char)CurrCoarsestBrick.field_0.field_0.Y._3_1_ < '\0') {
        return;
      }
      BrickIndex = *(u64 *)((long)&CurrCoarsestBrick +
                           (long)(char)CurrCoarsestBrick.field_0.field_0.Y._3_1_ * 0x10 + 8);
      Current.Brick3.field_0.field_3.XY.field_0 =
           (v2<int>)*(undefined8 *)
                     ((anon_union_8_4_6ba14846_for_v2<int>_1 *)
                     (Stack + (char)CurrCoarsestBrick.field_0.field_0.Y._3_1_))->E;
      Brick3.field_0._0_8_ = (ulong)Current.Brick3.field_0.field_3.XY.field_0 & 0xffffffff;
      Brick3.field_0._8_4_ = (undefined4)in_R8;
      in_R8 = in_R8 & 0xffffffff;
      CurrCoarsestBrick.field_0.field_0.Y._3_1_ = CurrCoarsestBrick.field_0.field_0.Y._3_1_ + -1;
      uVar7 = GetLinearBrick((idx2 *)Stack[0x7f]._8_8_,
                             (idx2_file *)
                             (ulong)(uint)(int)(char)Current.Brick3.field_0.field_0.Y._0_1_,
                             (int)BrickIndex,Brick3);
      BrickIt.Idx = (i64)((unsigned_long *)(long)(char)Current.Brick3.field_0.field_0.Y._0_1_ +
                         uVar7 * 2);
      Lookup<unsigned_long,idx2::brick_volume>
                ((iterator *)&I,(idx2 *)Bp,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&BrickIt.Idx,
                 (unsigned_long *)(long)(char)Current.Brick3.field_0.field_0.Y._0_1_);
      if (*(char *)((long)&(BrickIt.Ht)->Keys +
                   (long)&(((BrickIt.Val)->Vol).Buffer.Alloc)->_vptr_allocator) == '\x02') {
        uVar4 = Current.Brick3.field_0.field_0.Y._0_1_;
        Current.Brick3.field_0.field_0.Y._1_1_ = uVar4;
      }
      if ((char)Current.Brick3.field_0.field_0.Y._0_1_ < '\x01') {
        if ('\0' < (char)Current.Brick3.field_0.field_0.Y._1_1_) {
          local_10 = &Bp->ResolutionLevels;
          (local_10->Buffer).Data[uVar7] = Current.Brick3.field_0.field_0.Y._1_1_;
          local_18 = uVar7;
        }
      }
      else {
        for (Y = 0; Y < 8; Y = Y + 1) {
          local_a2c = (uint)((Y & 1U) != 0);
          ChildBrick3.field_0.field_0.Z = (int)(((uint)Y >> 1 & 1) != 0);
          ChildBrick3.field_0.field_0.Y = (int)(((uint)Y >> 2 & 1) != 0);
          local_98 = (int *)(Stack[0x7f]._8_8_ + 0xb38);
          local_90 = &BrickIndex;
          local_74 = (int)BrickIndex * *local_98;
          local_78 = BrickIndex._4_4_ * *(int *)(Stack[0x7f]._8_8_ + 0xb3c);
          local_a18 = Current.Brick3.field_0.field_0.X * *(int *)(Stack[0x7f]._8_8_ + 0xb40);
          local_70 = &local_88;
          local_88._0_4_ = local_74;
          local_88._4_4_ = local_78;
          local_a8 = local_88;
          local_a20 = local_88;
          local_a10 = local_88;
          uVar2 = local_a10;
          local_40 = &local_a2c;
          local_a10._0_4_ = (int)local_88;
          local_a10._4_4_ = (int)((ulong)local_88 >> 0x20);
          in_R8 = (ulong)local_a2c;
          local_5c = (int)local_a10 + local_a2c;
          local_60 = local_a10._4_4_ + ChildBrick3.field_0.field_0.Z;
          ChildBrick3.field_0.field_0.X = local_a18 + ChildBrick3.field_0.field_0.Y;
          local_58 = &local_b4;
          local_b4._0_4_ = local_5c;
          local_b4._4_4_ = local_60;
          local_a00 = local_b4;
          uVar3 = local_a00;
          local_a10 = uVar2;
          local_a08 = local_a18;
          local_a0 = local_a18;
          local_7c = local_a18;
          local_64 = ChildBrick3.field_0.field_0.X;
          local_4c = ChildBrick3.field_0.field_0.Y;
          local_48 = ChildBrick3.field_0.field_0.Z;
          local_44 = local_a2c;
          local_a28 = ChildBrick3.field_0.field_0.Z;
          local_a24 = ChildBrick3.field_0.field_0.Y;
          if (0xf < (char)(Current.Brick3.field_0.field_0.Y._0_1_ + -1)) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                         );
          }
          local_28 = (int *)(Stack[0x7f]._8_8_ + 0x3f0 +
                            (long)(int)(char)(Current.Brick3.field_0.field_0.Y._0_1_ + -1) * 0xc);
          local_20 = &local_a00;
          local_a00._0_4_ = (int)local_b4;
          bVar1 = false;
          if ((int)local_a00 < *local_28) {
            local_a00._4_4_ = (int)((ulong)local_b4 >> 0x20);
            bVar1 = false;
            if (local_a00._4_4_ < local_28[1]) {
              bVar1 = ChildBrick3.field_0.field_0.X < local_28[2];
            }
          }
          if (bVar1) {
            CurrCoarsestBrick.field_0.field_0.Y._3_1_ =
                 CurrCoarsestBrick.field_0.field_0.Y._3_1_ + '\x01';
            lVar8 = (long)(char)CurrCoarsestBrick.field_0.field_0.Y._3_1_;
            *(undefined8 *)((long)&CurrCoarsestBrick + lVar8 * 0x10 + 8) = local_b4;
            Stack[lVar8].Brick3.field_0.field_0.X = ChildBrick3.field_0.field_0.X;
            *(char *)((long)&Stack[lVar8].Brick3.field_0 + 4) =
                 Current.Brick3.field_0.field_0.Y._0_1_ + -1;
            *(undefined1 *)((long)&Stack[lVar8].Brick3.field_0 + 5) =
                 Current.Brick3.field_0.field_0.Y._1_1_;
          }
          local_a00 = uVar3;
        }
      }
    } while (-1 < (char)CurrCoarsestBrick.field_0.field_0.Y._3_1_);
    First._0_4_ = (int)First + 1;
    iVar6 = *(char *)(Stack[0x7f]._8_8_ + 0x9e8) + -1;
    if (0xf < iVar6) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                   );
    }
    if (*(int *)(Stack[0x7f]._8_8_ + 0x3f0 + (long)iVar6 * 0xc) <= (int)First) {
      First._0_4_ = 0;
      First._4_4_ = First._4_4_ + 1;
      iVar6 = *(char *)(Stack[0x7f]._8_8_ + 0x9e8) + -1;
      if (0xf < iVar6) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      if (*(int *)(Stack[0x7f]._8_8_ + (long)iVar6 * 0xc + 0x3f4) <= First._4_4_) {
        First._4_4_ = 0;
        CurrCoarsestBrick.field_0.field_0.X = CurrCoarsestBrick.field_0.field_0.X + 1;
      }
    }
    iVar6 = *(char *)(Stack[0x7f]._8_8_ + 0x9e8) + -1;
    if (0xf < iVar6) break;
    local_38 = (int *)(Stack[0x7f]._8_8_ + 0x3f0 + (long)iVar6 * 0xc);
    local_30 = &First;
    bVar1 = false;
    if (((int)First < *local_38) && (bVar1 = false, First._4_4_ < local_38[1])) {
      bVar1 = CurrCoarsestBrick.field_0.field_0.X < local_38[2];
    }
    if (bVar1) {
      CurrCoarsestBrick.field_0.field_0.Y._3_1_ = CurrCoarsestBrick.field_0.field_0.Y._3_1_ + '\x01'
      ;
      lVar8 = (long)(char)CurrCoarsestBrick.field_0.field_0.Y._3_1_;
      *(ulong *)((long)&CurrCoarsestBrick + lVar8 * 0x10 + 8) = CONCAT44(First._4_4_,(int)First);
      Stack[lVar8].Brick3.field_0.field_0.X = CurrCoarsestBrick.field_0.field_0.X;
      cVar5 = *(char *)(Stack[0x7f]._8_8_ + 0x9e8) + -1;
      *(char *)((long)&Stack[lVar8].Brick3.field_0 + 5) = cVar5;
      *(char *)((long)&Stack[lVar8].Brick3.field_0 + 4) = cVar5;
    }
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
               );
}

Assistant:

void
ComputeBrickResolution(brick_pool* Bp)
{
  const idx2_file* Idx2 = Bp->Idx2;
  stack_item Stack[idx2_file::MaxLevels * 8];
  i8 LastIndex = 0;
  /* push all bricks at the coarsest level */
  v3i CurrCoarsestBrick = v3i(0);
  stack_item& First = Stack[LastIndex];
  First.Brick3 = CurrCoarsestBrick;
  First.Level = First.ResolutionToSet = Idx2->NLevels - 1;
  //i64 Count = 0;
  while (LastIndex >= 0)
  {
    // pop the stack
    stack_item Current = Stack[LastIndex--];
    // get the current brick
    u64 BrickIndex = GetLinearBrick(*Idx2, Current.Level, Current.Brick3);
    u64 BrickKey = GetBrickKey(Current.Level, BrickIndex);
    auto BrickIt = Lookup(Bp->BrickTable, BrickKey);

    if (BrickIt)
    {
      idx2_Assert(BrickIt.Val->Significant);
      Current.ResolutionToSet = Current.Level;
    }
    // push the children if not at the finest level
    if (Current.Level > 0)
    {
      i8 NextLevel = Current.Level - 1;
      for (int I = 0; I < 8; ++I)
      {
        int X = BitSet(I, 0);
        int Y = BitSet(I, 1);
        int Z = BitSet(I, 2);
        v3i ChildBrick3 = Current.Brick3 * Idx2->GroupBrick3 + v3i(X, Y, Z);
        if (ChildBrick3 < Idx2->NBricks3[NextLevel])
        {
          stack_item& Child = Stack[++LastIndex];
          Child.Brick3 = ChildBrick3;
          Child.Level = Current.Level - 1;
          Child.ResolutionToSet = Current.ResolutionToSet;
        }
      }
    }
    else // finest level, set the level if necessary
    {
      // TODO: we should just stuff 4 bits into the brick key instead of using a separate
      // ResolutionStream
      if (Current.ResolutionToSet > 0)
      {// by default, the bit stream is init to 0 so no need to write if ResolutionToSet == 0
        Bp->ResolutionLevels[BrickIndex] = Current.ResolutionToSet;
      }
      //printf("level = %d\n", Current.ResolutionToSet);
      //v3i Brick3 = GetSpatialBrick(*Idx2, Current.Level, BrickIndex);
      //idx2_Assert(Brick3 == Current.Brick3);
      //++Count;
    }

    /* push the next brick at the coarsest resolution if stack is empty */
    if (LastIndex < 0)
    {
      ++CurrCoarsestBrick.X;
      if (CurrCoarsestBrick.X >= Idx2->NBricks3[Idx2->NLevels - 1].X)
      {
        CurrCoarsestBrick.X = 0;
        ++CurrCoarsestBrick.Y;
        if (CurrCoarsestBrick.Y >= Idx2->NBricks3[Idx2->NLevels - 1].Y)
        {
          CurrCoarsestBrick.Y = 0;
          ++CurrCoarsestBrick.Z;
        }
      }
      if (CurrCoarsestBrick < Idx2->NBricks3[Idx2->NLevels - 1])
      {
        stack_item& Next = Stack[++LastIndex];
        Next.Brick3 = CurrCoarsestBrick;
        Next.Level = Next.ResolutionToSet = Idx2->NLevels - 1;
      }
    }
  }

  //printf("num finest bricks = %" PRIi64 "\n", Count);
}